

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall luna::CodeGenerateVisitor::EnterFunction(CodeGenerateVisitor *this)

{
  GenerateFunction *pGVar1;
  int iVar2;
  GenerateFunction *pGVar3;
  Function *obj;
  
  pGVar3 = (GenerateFunction *)operator_new(0x40);
  pGVar3->parent_ = (GenerateFunction *)0x0;
  pGVar3->current_block_ = (GenerateBlock *)0x0;
  pGVar3->function_ = (Function *)0x0;
  pGVar3->func_index_ = 0;
  pGVar3->register_id_ = 0;
  pGVar3->register_max_ = 0;
  (pGVar3->loop_jumps_).super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pGVar3->loop_jumps_;
  (pGVar3->loop_jumps_).super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pGVar3->loop_jumps_;
  (pGVar3->loop_jumps_).super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>.
  _M_impl._M_node._M_size = 0;
  pGVar1 = this->current_function_;
  pGVar3->parent_ = pGVar1;
  this->current_function_ = pGVar3;
  obj = State::NewFunction(this->state_);
  this->current_function_->function_ = obj;
  if (((obj->super_GCObject).field_0x10 & 3) != 0) {
    GC::SetBarrier((this->state_->gc_)._M_t.
                   super___uniq_ptr_impl<luna::GC,_std::default_delete<luna::GC>_>._M_t.
                   super__Tuple_impl<0UL,_luna::GC_*,_std::default_delete<luna::GC>_>.
                   super__Head_base<0UL,_luna::GC_*,_false>._M_head_impl,&obj->super_GCObject);
  }
  if (pGVar1 != (GenerateFunction *)0x0) {
    iVar2 = Function::AddChildFunction(pGVar1->function_,pGVar3->function_);
    pGVar3->func_index_ = iVar2;
    Function::SetSuperior(pGVar3->function_,pGVar1->function_);
    Function::SetModuleName(pGVar3->function_,pGVar1->function_->module_);
    return;
  }
  return;
}

Assistant:

void EnterFunction()
        {
            auto function = new GenerateFunction;
            auto parent = current_function_;
            function->parent_ = parent;
            current_function_ = function;

            // New function is default on GCGen2, so barrier it
            current_function_->function_ = state_->NewFunction();
            CHECK_BARRIER(state_->GetGC(), current_function_->function_);

            if (parent)
            {
                auto index = parent->function_->AddChildFunction(function->function_);
                function->func_index_ = index;
                function->function_->SetSuperior(parent->function_);
                function->function_->SetModuleName(parent->function_->GetModule());
            }
        }